

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

size_t encode_varint64(uint64_t val,char *buf)

{
  size_t sVar1;
  byte local_21;
  size_t sStack_20;
  uint8_t byte;
  size_t i;
  char *buf_local;
  uint64_t val_local;
  
  sStack_20 = 0;
  buf_local = (char *)val;
  do {
    local_21 = (byte)buf_local & 0x7f;
    buf_local = (char *)((ulong)buf_local >> 7);
    if (buf_local != (char *)0x0) {
      local_21 = local_21 | 0x80;
    }
    sVar1 = sStack_20 + 1;
    buf[sStack_20] = local_21;
    sStack_20 = sVar1;
  } while (buf_local != (char *)0x0);
  return sVar1;
}

Assistant:

UPB_NOINLINE
static size_t encode_varint64(uint64_t val, char* buf) {
  size_t i = 0;
  do {
    uint8_t byte = val & 0x7fU;
    val >>= 7;
    if (val) byte |= 0x80U;
    buf[i++] = byte;
  } while (val);
  return i;
}